

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Dist_graph_create
              (MPIABI_Comm comm_old,int n,int *sources,int *degrees,int *destinations,int *weights,
              MPIABI_Info info,int reorder,MPIABI_Comm *comm_dist_graph)

{
  int iVar1;
  
  iVar1 = MPI_Dist_graph_create();
  return iVar1;
}

Assistant:

int MPIABI_Dist_graph_create(
  MPIABI_Comm comm_old,
  int n,
  const int * sources,
  const int * degrees,
  const int * destinations,
  const int * weights,
  MPIABI_Info info,
  int reorder,
  MPIABI_Comm * comm_dist_graph
) {
  return MPI_Dist_graph_create(
    (MPI_Comm)(WPI_Comm)comm_old,
    n,
    sources,
    degrees,
    destinations,
    weights,
    (MPI_Info)(WPI_Info)info,
    reorder,
    (MPI_Comm *)(WPI_CommPtr)comm_dist_graph
  );
}